

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotation.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorRotation::Update(ChLinkMotorRotation *this,double mytime,bool update_assets)

{
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ChFrameMoving<double> aframe12;
  ChFrameMoving<double> aframe2;
  ChFrameMoving<double> aframe1;
  ChVector<double> local_408;
  ChFrameMoving<double> local_3f0;
  ChFrameMoving<double> local_2f8;
  ChFrameMoving<double> local_200;
  ChFrameMoving<double> local_108;
  
  ChLinkMotor::Update(&this->super_ChLinkMotor,mytime,update_assets);
  ChFrameMoving<double>::ChFrameMoving
            (&local_200,&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame1);
  ChFrameMoving<double>::ChFrameMoving
            (&local_3f0,
             &((this->super_ChLinkMotor).super_ChLinkMateGeneric.super_ChLinkMate.super_ChLink.Body1
              )->super_ChFrameMoving<double>);
  ChFrameMoving<double>::operator>>(&local_108,&local_200,&local_3f0);
  ChFrameMoving<double>::ChFrameMoving
            (&local_3f0,&(this->super_ChLinkMotor).super_ChLinkMateGeneric.frame2);
  ChFrameMoving<double>::ChFrameMoving
            (&local_2f8,
             &((this->super_ChLinkMotor).super_ChLinkMateGeneric.super_ChLinkMate.super_ChLink.Body2
              )->super_ChFrameMoving<double>);
  ChFrameMoving<double>::operator>>(&local_200,&local_3f0,&local_2f8);
  local_2f8.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
  local_408.m_data[2] = 0.0;
  local_2f8.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  local_408.m_data[0] = 0.0;
  local_408.m_data[1] = 0.0;
  local_2f8.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_2f8.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&local_3f0,&local_408,(ChQuaternion<double> *)&local_2f8);
  ChFrameMoving<double>::TransformParentToLocal(&local_200,&local_108,&local_3f0);
  dVar1 = this->mrot;
  dVar5 = remainder(dVar1,6.283185307179586);
  ChQuaternion<double>::Q_to_Rotv
            ((ChVector<double> *)&local_2f8,&local_3f0.super_ChFrame<double>.coord.rot);
  dVar6 = remainder(local_2f8.super_ChFrame<double>.coord.pos.m_data[1],6.283185307179586);
  auVar9._8_8_ = 0x7fffffffffffffff;
  auVar9._0_8_ = 0x7fffffffffffffff;
  dVar1 = dVar6 + (dVar1 - dVar5);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar6 - dVar5;
  auVar10 = vandpd_avx(auVar10,auVar9);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (dVar6 + 6.283185307179586) - dVar5;
  auVar7 = vandpd_avx(auVar8,auVar9);
  uVar2 = vcmpsd_avx512f(auVar7,auVar10,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (dVar6 + -6.283185307179586) - dVar5;
  auVar7 = vandpd_avx(auVar7,auVar9);
  uVar2 = vcmpsd_avx512f(auVar7,auVar10,1);
  bVar4 = (bool)((byte)uVar2 & 1);
  this->mrot = (double)((ulong)bVar4 * (long)(dVar1 + -6.283185307179586) +
                       (ulong)!bVar4 *
                       ((ulong)bVar3 * (long)(dVar1 + 6.283185307179586) +
                       (ulong)!bVar3 * (long)dVar1));
  ChFrameMoving<double>::GetWvel_loc((ChVector<double> *)&local_2f8,&local_3f0);
  this->mrot_dt = local_2f8.super_ChFrame<double>.coord.pos.m_data[1];
  ChFrameMoving<double>::GetWacc_loc((ChVector<double> *)&local_2f8,&local_3f0);
  this->mrot_dtdt = local_2f8.super_ChFrame<double>.coord.pos.m_data[1];
  return;
}

Assistant:

void ChLinkMotorRotation::Update(double mytime, bool update_assets) {
    // Inherit parent class:
    ChLinkMotor::Update(mytime, update_assets);

    // compute aux data for future reference (istantaneous pos speed accel)
    ChFrameMoving<> aframe1 = ChFrameMoving<>(this->frame1) >> (ChFrameMoving<>)(*this->Body1);
    ChFrameMoving<> aframe2 = ChFrameMoving<>(this->frame2) >> (ChFrameMoving<>)(*this->Body2);
    ChFrameMoving<> aframe12;
    aframe2.TransformParentToLocal(aframe1, aframe12);

    // multi-turn rotation code
    double last_totrot = this->mrot;
    double last_rot = remainder(last_totrot, CH_C_2PI);
    double last_turns = last_totrot - last_rot;
    double new_rot = remainder(aframe12.GetRot().Q_to_Rotv().z(), CH_C_2PI);
    this->mrot = last_turns + new_rot;
    if (fabs(new_rot + CH_C_2PI - last_rot) < fabs(new_rot - last_rot))
        this->mrot = last_turns + new_rot + CH_C_2PI;
    if (fabs(new_rot - CH_C_2PI - last_rot) < fabs(new_rot - last_rot))
        this->mrot = last_turns + new_rot - CH_C_2PI;

    this->mrot_dt = aframe12.GetWvel_loc().z();
    this->mrot_dtdt = aframe12.GetWacc_loc().z();
}